

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

bool lest::is_number(text *arg)

{
  long lVar1;
  bool local_79;
  allocator local_51;
  string local_50 [32];
  string local_30 [8];
  text digits;
  text *arg_local;
  
  digits.field_2._8_8_ = arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"0123456789",&local_51);
  std::__cxx11::string::string(local_30,local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  lVar1 = std::__cxx11::string::find_first_of((string *)arg,(ulong)local_30);
  local_79 = false;
  if (lVar1 != -1) {
    lVar1 = std::__cxx11::string::find_first_not_of((string *)arg,(ulong)local_30);
    local_79 = lVar1 == -1;
  }
  std::__cxx11::string::~string(local_30);
  return local_79;
}

Assistant:

inline bool is_number( text arg )
{
    const text digits = "0123456789";
    return text::npos != arg.find_first_of    ( digits )
        && text::npos == arg.find_first_not_of( digits );
}